

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

MPP_RET mpp_enc_refs_set_cfg(MppEncRefs refs,MppEncRefCfg ref_cfg)

{
  int *__s;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  MPP_RET MVar8;
  undefined4 *puVar9;
  long lVar10;
  
  if (refs == (MppEncRefs)0x0) {
LAB_0014c39c:
    _mpp_log_l(2,"mpp_enc_refs","invalid input refs %p ref_cfg %p\n","mpp_enc_refs_set_cfg",refs,
               ref_cfg);
    MVar8 = MPP_ERR_VALUE;
  }
  else {
    if (ref_cfg != (MppEncRefCfg)0x0) {
      MVar8 = _check_is_mpp_enc_ref_cfg("mpp_enc_refs_set_cfg",ref_cfg);
      if (MVar8 != MPP_OK) goto LAB_0014c39c;
    }
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p cfg %p\n","mpp_enc_refs_set_cfg",refs,ref_cfg);
    }
    if (ref_cfg == (MppEncRefCfg)0x0) {
      ref_cfg = mpp_enc_ref_default();
    }
    *(MppEncRefCfg *)((long)refs + 8) = ref_cfg;
    *(byte *)refs = *refs | 1;
    __s = (int *)((long)refs + 0x40);
    *(undefined4 *)((long)refs + 0x38) = 0;
    if (*(int *)((long)ref_cfg + 0x10) == 0) {
      memset(__s,0,0x5a8);
      *(undefined4 *)((long)refs + 0x38) = 1;
    }
    if (*(int *)((long)ref_cfg + 0x1c) != 0) {
      if (0xf < *(int *)((long)ref_cfg + 0x1c)) {
        _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cfg->lt_cfg_cnt < 16","mpp_enc_refs_set_cfg",0xf6);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
      iVar1 = *(int *)((long)ref_cfg + 0x1c);
      if (0 < (long)iVar1) {
        puVar9 = (undefined4 *)(*(long *)((long)ref_cfg + 0x28) + 0x14);
        lVar10 = 0;
        do {
          uVar2 = *puVar9;
          *(undefined4 *)((long)refs + lVar10 + 0x360) = uVar2;
          *(undefined4 *)((long)refs + lVar10 + 0x364) = uVar2;
          *(undefined4 *)((long)refs + lVar10 + 0x368) = puVar9[-1];
          *(undefined4 *)((long)refs + lVar10 + 0x374) = puVar9[-5];
          *(undefined4 *)((long)refs + lVar10 + 0x378) = puVar9[-4];
          *(undefined4 *)((long)refs + lVar10 + 0x37c) = puVar9[-3];
          *(undefined4 *)((long)refs + lVar10 + 0x380) = puVar9[-2];
          puVar9 = puVar9 + 6;
          lVar10 = lVar10 + 0x24;
        } while ((long)iVar1 * 0x24 != lVar10);
      }
    }
    if ((*__s != 0) && (*__s < *(int *)((long)ref_cfg + 0x38))) {
      *(undefined4 *)((long)refs + 0x38) = 1;
    }
    iVar1 = *(int *)((long)ref_cfg + 0x38);
    uVar2 = *(undefined4 *)((long)ref_cfg + 0x3c);
    uVar3 = *(undefined4 *)((long)ref_cfg + 0x40);
    uVar4 = *(undefined4 *)((long)ref_cfg + 0x44);
    uVar5 = *(undefined4 *)((long)ref_cfg + 0x48);
    uVar6 = *(undefined4 *)((long)ref_cfg + 0x4c);
    uVar7 = *(undefined4 *)((long)ref_cfg + 0x50);
    *(undefined4 *)((long)refs + 0x4c) = *(undefined4 *)((long)ref_cfg + 0x44);
    *(undefined4 *)((long)refs + 0x50) = uVar5;
    *(undefined4 *)((long)refs + 0x54) = uVar6;
    *(undefined4 *)((long)refs + 0x58) = uVar7;
    *__s = iVar1;
    *(undefined4 *)((long)refs + 0x44) = uVar2;
    *(undefined4 *)((long)refs + 0x48) = uVar3;
    *(undefined4 *)((long)refs + 0x4c) = uVar4;
    if (((byte)enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","ref_cfg cpb size: lt %d st %d max lt_idx %d tid %d\n",
                 "mpp_enc_refs_set_cfg",(ulong)*(uint *)((long)refs + 0x44),
                 (ulong)*(uint *)((long)refs + 0x48),(ulong)*(uint *)((long)refs + 0x4c),
                 (ulong)*(uint *)((long)refs + 0x50));
    }
    MVar8 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar8 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p cfg %p\n","mpp_enc_refs_set_cfg",refs,ref_cfg);
    }
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_enc_refs_set_cfg(MppEncRefs refs, MppEncRefCfg ref_cfg)
{
    if (NULL == refs || (ref_cfg && check_is_mpp_enc_ref_cfg(ref_cfg))) {
        mpp_err_f("invalid input refs %p ref_cfg %p\n", refs, ref_cfg);
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p cfg %p\n", refs, ref_cfg);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    EncVirtualCpb *cpb = &p->cpb;
    MppEncRefCfgImpl *cfg = NULL;

    if (NULL == ref_cfg)
        ref_cfg = mpp_enc_ref_default();

    cfg = (MppEncRefCfgImpl *)ref_cfg;

    p->ref_cfg = cfg;
    p->changed |= ENC_REFS_REF_CFG_CHANGED;
    p->hdr_need_update = 0;

    /* clear cpb on setup new cfg */
    if (!cfg->keep_cpb) {
        memset(cpb, 0, sizeof(*cpb));
        p->hdr_need_update = 1;
    }

    if (cfg->lt_cfg_cnt) {
        RK_S32 i;

        mpp_assert(cfg->lt_cfg_cnt < MAX_CPB_LT_FRM);

        for (i = 0; i < cfg->lt_cfg_cnt; i++) {
            RefsCnt *lt_cnt = &cpb->lt_cnter[i];
            MppEncRefLtFrmCfg *lt_cfg = &cfg->lt_cfg[i];

            lt_cnt->delay       = lt_cfg->lt_delay;
            lt_cnt->delay_cnt   = lt_cfg->lt_delay;
            lt_cnt->len         = lt_cfg->lt_gap;
            lt_cnt->lt_idx      = lt_cfg->lt_idx;
            lt_cnt->tid         = lt_cfg->temporal_id;
            lt_cnt->ref_mode    = lt_cfg->ref_mode;
            lt_cnt->ref_arg     = lt_cfg->ref_arg;
        }
    }

    MppEncCpbInfo *info = &cpb->info;

    if (info->dpb_size && info->dpb_size < cfg->cpb_info.dpb_size)
        p->hdr_need_update = 1;

    memcpy(info, &cfg->cpb_info, sizeof(cfg->cpb_info));

    enc_refs_dbg_flow("ref_cfg cpb size: lt %d st %d max lt_idx %d tid %d\n",
                      info->max_lt_cnt, info->max_st_cnt,
                      info->max_lt_idx, info->max_st_tid);

    enc_refs_dbg_func("leave %p cfg %p\n", refs, ref_cfg);
    return MPP_OK;
}